

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O1

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *opt)

{
  int iVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  int _h;
  undefined4 *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int i;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  undefined4 *puVar19;
  ulong uVar20;
  Mat weight_data_r2;
  Mat local_78;
  
  p_Var2 = this->_vptr_Convolution1D_x86[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var2) == 0) {
    uVar10 = (long)*(int *)(&this->field_0xf0 + (long)p_Var2) /
             (long)*(int *)(&this->field_0xd4 + (long)p_Var2);
    uVar10 = (long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
             (long)(int)*(uint *)(&this->field_0xd0 + (long)p_Var2);
    _h = (int)uVar10;
    uVar16 = 1;
    uVar18 = 1;
    if (opt->use_packing_layout == true) {
      uVar16 = (ulong)((uint)((uVar10 & 3) == 0) * 3 + 1);
      uVar18 = (ulong)((uint)((*(uint *)(&this->field_0xd0 + (long)p_Var2) & 3) == 0) * 3 + 1);
    }
    p_Var2 = this->_vptr_Convolution1D_x86[-3];
    Mat::reshape(&local_78,(Mat *)(&this->field_0x148 + (long)p_Var2),
                 *(int *)(&this->field_0xd4 + (long)p_Var2),_h,
                 *(int *)(&this->field_0xd0 + (long)p_Var2),(Allocator *)0x0);
    iVar15 = (int)uVar16;
    iVar17 = (int)uVar18;
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86[-3]),
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar10 & 0xffffffff) / (long)iVar15
                     ),*(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) /
                       iVar17,(ulong)(uint)(iVar17 * iVar15 * 4),iVar17 * iVar15,(Allocator *)0x0);
    pp_Var3 = this->_vptr_Convolution1D_x86;
    if (iVar17 <= *(int *)(&this->field_0xd0 + (long)pp_Var3[-3])) {
      pp_Var4 = this->_vptr_Convolution1D_x86;
      pvVar5 = (this->weight_data_packed).data;
      sVar6 = (this->weight_data_packed).elemsize;
      sVar7 = (this->weight_data_packed).cstep;
      iVar1 = (this->weight_data_packed).w;
      uVar10 = 0;
      do {
        if (iVar15 <= _h) {
          uVar12 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3])) {
              puVar8 = (undefined4 *)
                       ((long)pvVar5 +
                       ((uVar12 & 0xffffffff) / uVar16) * (long)iVar1 * sVar6 +
                       sVar7 * sVar6 * ((uVar10 & 0xffffffff) / uVar18));
              lVar9 = 0;
              lVar14 = 0;
              do {
                uVar13 = 0;
                uVar11 = uVar12;
                do {
                  puVar19 = (undefined4 *)
                            ((long)local_78.data +
                            ((long)local_78.w * uVar11 + uVar10 * local_78.cstep) *
                            local_78.elemsize + lVar9);
                  uVar20 = uVar18;
                  do {
                    *puVar8 = *puVar19;
                    puVar8 = puVar8 + 1;
                    puVar19 = (undefined4 *)((long)puVar19 + local_78.cstep * local_78.elemsize);
                    uVar20 = uVar20 - 1;
                  } while (uVar20 != 0);
                  uVar13 = uVar13 + 1;
                  uVar11 = uVar11 + 1;
                } while (uVar13 != uVar16);
                lVar14 = lVar14 + 1;
                lVar9 = lVar9 + 4;
              } while (lVar14 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3]));
            }
            uVar12 = uVar12 + uVar16;
          } while ((long)uVar12 < (long)((long)_h - (ulong)(iVar15 - 1)));
        }
        uVar10 = uVar10 + uVar18;
      } while ((long)((iVar17 - 1) + uVar10) < (long)*(int *)(&this->field_0xd0 + (long)pp_Var3[-3])
              );
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            Mat g0 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                float* g00 = g0.row(p / elempack);

                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}